

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::anon_unknown_24::ContainsBadUnderscores(anon_unknown_24 *this,string_view name)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  uchar *puVar4;
  ulong local_28;
  size_t i;
  string_view name_local;
  
  name_local._M_len = name._M_len;
  i = (size_t)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&i);
  if (bVar1) {
    name_local._M_str._7_1_ = false;
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       ((basic_string_view<char,_std::char_traits<char>_> *)&i,0);
    if (*pvVar2 != '_') {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&i);
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&i,sVar3 - 1);
      if (*pvVar2 != '_') {
        local_28 = 1;
        do {
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&i);
          if (sVar3 <= local_28) {
            return false;
          }
          pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&i,local_28 - 1);
          if (*pvVar2 == '_') {
            puVar4 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                        ((basic_string_view<char,_std::char_traits<char>_> *)&i,
                                         local_28);
            bVar1 = absl::lts_20250127::ascii_isalpha(*puVar4);
            if (!bVar1) {
              return true;
            }
          }
          local_28 = local_28 + 1;
        } while( true );
      }
    }
    name_local._M_str._7_1_ = true;
  }
  return name_local._M_str._7_1_;
}

Assistant:

bool ContainsBadUnderscores(absl::string_view name) {
  if (name.empty()) {
    return false;
  }
  if (name[0] == '_' || name[name.size() - 1] == '_') {
    return true;
  }
  for (size_t i = 1; i < name.size(); ++i) {
    if (name[i - 1] == '_' && !absl::ascii_isalpha(name[i])) {
      return true;
    }
  }
  return false;
}